

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.h
# Opt level: O2

ChCoordsys<double> * __thiscall
chrono::fea::ChLinkPointPoint::GetLinkAbsoluteCoords
          (ChCoordsys<double> *__return_storage_ptr__,ChLinkPointPoint *this)

{
  ChCoordsys<double>::ChCoordsys(__return_storage_ptr__,(ChCoordsys<double> *)CSYSNORM);
  return __return_storage_ptr__;
}

Assistant:

virtual ChCoordsys<> GetLinkAbsoluteCoords() override { return CSYSNORM; }